

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int lws_system_do_attach(lws_context_per_thread *pt)

{
  _func_int_lws_context_ptr_int_lws_attach_cb_t_lws_system_states_t_void_ptr_lws_attach_item_ptr_ptr
  *p_Var1;
  bool bVar2;
  int iVar3;
  lws_attach_item *in_RAX;
  int unaff_EBP;
  lws_attach_item *item;
  lws_attach_item *local_38;
  
  local_38 = in_RAX;
  while( true ) {
    if ((pt->attach_owner).count == 0) {
      return 0;
    }
    p_Var1 = pt->context->system_ops->attach;
    if (p_Var1 == (_func_int_lws_context_ptr_int_lws_attach_cb_t_lws_system_states_t_void_ptr_lws_attach_item_ptr_ptr
                   *)0x0) break;
    iVar3 = (*p_Var1)(pt->context,(int)pt->tid,(lws_attach_cb_t)0x0,LWS_SYSTATE_UNKNOWN,(void *)0x0,
                      &local_38);
    if (iVar3 == 0) {
      if (local_38 == (lws_attach_item *)0x0) {
        unaff_EBP = 0;
        bVar2 = false;
      }
      else {
        (*local_38->cb)(pt->context,(int)pt->tid,local_38->opaque);
        lws_realloc(local_38,0,"lws_free");
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
      unaff_EBP = 1;
      _lws_log(1,"%s: attach problem\n","lws_system_do_attach");
    }
    if (!bVar2) {
      return unaff_EBP;
    }
  }
  __assert_fail("pt->context->system_ops->attach",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/system/system.c"
                ,0xe3,"int lws_system_do_attach(struct lws_context_per_thread *)");
}

Assistant:

int
lws_system_do_attach(struct lws_context_per_thread *pt)
{
	/*
	 * If nothing to do, we just return immediately
	 */

	while (pt->attach_owner.count) {

		struct lws_attach_item *item;

		/*
		 * If anybody used the attach apis, there must be an
		 * implementation of the (*attach) lws_system op function
		 */

		assert(pt->context->system_ops->attach);
		if (!pt->context->system_ops->attach) {
			lwsl_err("%s: define (*attach)\n", __func__);
			return 1;
		}

		/*
		 * System locking is applied only around this next call, while
		 * we detach and get a pointer to the tail attach item.  We
		 * become responsible to free what we have detached.
		 */

		if (pt->context->system_ops->attach(pt->context, pt->tid, NULL,
						    0, NULL, &item)) {
			lwsl_err("%s: attach problem\n", __func__);
			return 1;
		}

		if (!item)
			/* there's nothing more to do at the moment */
			return 0;

		/*
		 * Do the callback from the lws event loop thread
		 */

		item->cb(pt->context, pt->tid, item->opaque);

		/* it's done, destroy the item */

		lws_free(item);
	}

	return 0;
}